

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O1

int __thiscall
TPZSFMatrix<long_double>::Subst_LForward(TPZSFMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  int iVar6;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  int iVar7;
  long lVar8;
  longdouble *plVar9;
  long lVar10;
  longdouble *plVar11;
  long lVar12;
  longdouble in_ST0;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble lVar14;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble local_48;
  
  lVar12 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  iVar6 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar7 = 0;
  if ((lVar12 == CONCAT44(extraout_var,iVar6)) &&
     ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed != '\0')) {
    iVar6 = (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x10])(B);
    if (iVar6 != 0) {
      TPZMatrix<long_double>::Error
                ("virtual int TPZSFMatrix<long double>::Subst_LForward(TPZFMatrix<TVar> *) const [TVar = long double]"
                 ,"Subst_LForward <the matrix result can not be simetric>");
    }
    plVar9 = this->fElem;
    iVar6 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    iVar7 = 1;
    if (CONCAT44(extraout_var_00,iVar6) != 0 && -1 < extraout_var_00) {
      lVar12 = 0;
      do {
        if (0 < (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) {
          lVar10 = 0;
          do {
            lVar14 = (longdouble)0;
            lVar13 = in_ST0;
            lVar1 = in_ST1;
            lVar2 = in_ST2;
            lVar3 = in_ST3;
            lVar4 = in_ST4;
            lVar5 = in_ST5;
            if (lVar12 != 0) {
              lVar8 = 0;
              lVar14 = (longdouble)0;
              plVar11 = plVar9;
              do {
                lVar13 = in_ST1;
                lVar1 = *plVar11;
                plVar11 = plVar11 + 1;
                (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(B,lVar8,lVar10);
                lVar14 = lVar14 + lVar1 * in_ST0;
                lVar8 = lVar8 + 1;
                in_ST0 = lVar13;
                lVar1 = in_ST2;
                in_ST1 = in_ST2;
                lVar2 = in_ST3;
                in_ST2 = in_ST3;
                lVar3 = in_ST4;
                in_ST3 = in_ST4;
                lVar4 = in_ST5;
                in_ST4 = in_ST5;
                lVar5 = in_ST6;
                in_ST5 = in_ST6;
              } while (lVar12 != lVar8);
            }
            in_ST5 = in_ST6;
            in_ST4 = lVar5;
            in_ST3 = lVar4;
            in_ST2 = lVar3;
            in_ST1 = lVar2;
            in_ST0 = lVar1;
            (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(B,lVar12,lVar10);
            local_48 = lVar13 - lVar14;
            in_ST6 = in_ST5;
            (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar12,lVar10,&local_48);
            lVar10 = lVar10 + 1;
          } while (lVar10 < (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol);
        }
        lVar12 = lVar12 + 1;
        plVar9 = plVar9 + lVar12;
        iVar6 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0xc])(this);
      } while (lVar12 < CONCAT44(extraout_var_01,iVar6));
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

int
TPZSFMatrix<TVar> ::Subst_LForward( TPZFMatrix<TVar>  *B ) const
{
	if ( (B->Rows() != this->Dim()) || !this->fDecomposed )
		return( 0 );
	
	if ( B->IsSymmetric() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Subst_LForward <the matrix result can not be simetric>" );
	
	TVar *ptr_k = fElem;
	for ( int64_t k = 0; k < this->Dim(); k++, ptr_k += k )
		for ( int64_t j = 0; j < B->Cols(); j++ )
		{
			// Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
			//
			TVar *pk = ptr_k;
			TVar sum = 0.0;
			for ( int64_t i = 0; i < k; i++ )
				sum += (*pk++) * B->GetVal( i, j );
			
			// Faz b[k] = (b[k] - sum).
			//
			B->PutVal( k, j, B->GetVal( k, j ) - sum );
		}
	
	return( 1 );
}